

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O0

TabularDataFile * __thiscall asl::TabularDataFile::operator<<(TabularDataFile *this,Var *x)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  String *pSVar4;
  char *x_00;
  String local_b0;
  String local_98;
  undefined4 local_80;
  float local_7c;
  undefined1 local_78 [4];
  float y;
  String value;
  Var *item;
  undefined1 local_50 [4];
  int i;
  String row;
  Var local_28;
  Var *pVStack_18;
  bool rowFull;
  Var *x_local;
  TabularDataFile *this_local;
  
  local_28.field_1._a._space[7] = 0;
  pVStack_18 = x;
  x_local = (Var *)this;
  bVar1 = Var::operator==(x,"\n");
  if ((bVar1) && (iVar2 = Array<asl::Var>::length(&this->_row), 0 < iVar2)) {
    local_28.field_1._a._space[7] = 1;
  }
  else {
    bVar1 = Var::is(pVStack_18,ARRAY);
    if (bVar1) {
      Var::array(&local_28);
      Array<asl::Var>::operator=(&this->_row,(Array<asl::Var> *)&local_28);
      Array<asl::Var>::~Array((Array<asl::Var> *)&local_28);
    }
    else {
      Array<asl::Var>::operator<<(&this->_row,pVStack_18);
    }
  }
  iVar2 = Array<asl::Var>::length(&this->_row);
  iVar3 = Array<asl::String>::length(&this->_columnNames);
  if ((iVar2 == iVar3) || ((local_28.field_1._a._space[7] & 1) != 0)) {
    asl::String::String((String *)local_50);
    if ((this->_dataStarted & 1U) == 0) {
      asl::String::operator<<((String *)local_50,'\n');
      this->_dataStarted = true;
    }
    for (item._4_4_ = 0; iVar2 = Array<asl::Var>::length(&this->_row), item._4_4_ < iVar2;
        item._4_4_ = item._4_4_ + 1) {
      if (0 < item._4_4_) {
        asl::String::operator<<((String *)local_50,this->_separator);
      }
      value.field_2._8_8_ = Array<asl::Var>::operator[](&this->_row,item._4_4_);
      bVar1 = Var::ok((Var *)value.field_2._8_8_);
      if (bVar1) {
        Var::toString((String *)local_78,(Var *)value.field_2._8_8_);
      }
      else {
        asl::String::String((String *)local_78);
      }
      bVar1 = Var::is((Var *)value.field_2._8_8_,NUMBER);
      if ((bVar1) &&
         (local_7c = Var::operator_cast_to_float((Var *)value.field_2._8_8_), NAN(local_7c))) {
        local_80 = 4;
      }
      else {
        if ((this->_decimal == '.') || (bVar1 = Var::is((Var *)value.field_2._8_8_,NUMBER), !bVar1))
        {
          bVar1 = Var::is((Var *)value.field_2._8_8_,STRING);
          if (bVar1) {
            bVar1 = asl::String::contains((String *)local_78,this->_quote);
            if ((bVar1) ||
               (bVar1 = asl::String::contains((String *)local_78,this->_separator), bVar1)) {
              pSVar4 = asl::String::operator<<((String *)local_50,this->_quote);
              asl::String::String(&local_b0,this->_quote);
              asl::String::replace(&local_98,(String *)local_78,&local_b0,&this->_equote);
              pSVar4 = asl::String::operator<<(pSVar4,&local_98);
              asl::String::operator<<(pSVar4,this->_quote);
              asl::String::~String(&local_98);
              asl::String::~String(&local_b0);
            }
            else {
              asl::String::operator<<((String *)local_50,(String *)local_78);
            }
          }
          else {
            asl::String::operator<<((String *)local_50,(String *)local_78);
          }
        }
        else {
          asl::String::replaceme((String *)local_78,'.',this->_decimal);
          asl::String::operator<<((String *)local_50,(String *)local_78);
        }
        local_80 = 0;
      }
      asl::String::~String((String *)local_78);
    }
    asl::String::operator<<((String *)local_50,'\n');
    x_00 = asl::String::operator*((String *)local_50);
    TextFile::operator<<(&this->_file,x_00);
    iVar2 = this->_rowIndex + 1;
    this->_rowIndex = iVar2;
    if (iVar2 == this->_flushEvery) {
      File::flush((File *)this);
      this->_rowIndex = 0;
    }
    Array<asl::Var>::clear(&this->_row);
    asl::String::~String((String *)local_50);
  }
  return this;
}

Assistant:

TabularDataFile& TabularDataFile::operator<<(const Var& x)
{
	bool rowFull = false;
	if (x == "\n" && _row.length() > 0)
		rowFull = true;
	else if (x.is(Var::ARRAY))
		_row = x.array();
	else
		_row << x;
	if (_row.length() == _columnNames.length() || rowFull)
	{
		String row;
		if(!_dataStarted)
		{
			row << '\n';
			_dataStarted = true;
		}
		for(int i=0; i<_row.length(); i++)
		{
			if(i>0)
				row << _separator;
			Var& item = _row[i];
			String value = item.ok() ? item.toString() : String();

			if (item.is(Var::NUMBER))
			{
				float y = item; // print nans empty
				if (y != y)
					continue;
			}
			if (_decimal != '.' && item.is(Var::NUMBER))
			{
				value.replaceme('.', _decimal);
				row << value;
			}
			else if (item.is(Var::STRING))
			{
				if (value.contains(_quote) || value.contains(_separator))
					row << _quote << value.replace(_quote, _equote) << _quote;
				else
					row << value;
			}
			else
				row << value;
		}
		row << '\n';
		_file << *row;
		if(++_rowIndex == _flushEvery)
		{
			_file.flush();
			_rowIndex = 0;
		}
		_row.clear();
	}
	return *this;
}